

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

bool __thiscall
benchmark::internal::BenchmarkFamilies::FindBenchmarks
          (BenchmarkFamilies *this,string *spec,
          vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          *benchmarks)

{
  uint uVar1;
  pointer puVar2;
  Benchmark *pBVar3;
  BenchmarkImp *this_00;
  pointer pvVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint *puVar9;
  ostream *poVar10;
  pointer puVar11;
  vector<int,_std::allocator<int>_> *__range5;
  pointer __x;
  int *arg;
  int *piVar12;
  vector<int,_std::allocator<int>_> one_thread;
  MutexLock l;
  string error_msg;
  Regex re;
  uint *local_170;
  Instance local_148;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  unique_lock<std::mutex> local_a8;
  string local_98;
  string local_78;
  Regex local_58;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  Regex::Regex(&local_58);
  bVar6 = Regex::Init(&local_58,spec,&local_98);
  if (bVar6) {
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.name._M_dataplus._M_p._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_c8,(int *)&local_148);
    std::unique_lock<std::mutex>::unique_lock(&local_a8,&(this->mutex_).mut_);
    puVar2 = (this->families_).
             super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar11 = (this->families_).
                   super__Vector_base<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
        puVar11 = puVar11 + 1) {
      pBVar3 = (puVar11->_M_t).
               super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
               ._M_t.
               super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
               .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
      if (pBVar3 != (Benchmark *)0x0) {
        this_00 = pBVar3->imp_;
        iVar8 = BenchmarkImp::ArgsCnt(this_00);
        if (iVar8 == -1) {
          local_148.name._M_dataplus._M_p = (pointer)0x0;
          local_148.name._M_string_length = 0;
          local_148.name.field_2._M_allocated_capacity = 0;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(&this_00->args_,(value_type *)&local_148);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_148);
        }
        pvVar4 = (this_00->args_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (__x = (this_00->args_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __x != pvVar4; __x = __x + 1) {
          puVar9 = (uint *)(this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
          local_170 = (uint *)(this_00->thread_counts_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish;
          if (puVar9 == local_170) {
            local_170 = (uint *)local_c8._M_impl.super__Vector_impl_data._M_finish;
            puVar9 = (uint *)local_c8._M_impl.super__Vector_impl_data._M_start;
          }
          for (; puVar9 != local_170; puVar9 = puVar9 + 1) {
            uVar1 = *puVar9;
            local_148.name._M_dataplus._M_p = (pointer)&local_148.name.field_2;
            local_148.name._M_string_length = 0;
            local_148.name.field_2._M_allocated_capacity =
                 local_148.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_148.arg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_148.arg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_148.arg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::_M_assign((string *)&local_148);
            local_148.benchmark =
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_benchmark::internal::Benchmark_*,_std::default_delete<benchmark::internal::Benchmark>_>
                 .super__Head_base<0UL,_benchmark::internal::Benchmark_*,_false>._M_head_impl;
            local_148.report_mode = this_00->report_mode_;
            std::vector<int,_std::allocator<int>_>::operator=(&local_148.arg,__x);
            local_148.time_unit = this_00->time_unit_;
            local_148.range_multiplier = this_00->range_multiplier_;
            local_148.min_time = this_00->min_time_;
            local_148.repetitions = this_00->repetitions_;
            local_148.use_real_time = this_00->use_real_time_;
            local_148.use_manual_time = this_00->use_manual_time_;
            local_148.complexity = this_00->complexity_;
            local_148.complexity_lambda = this_00->complexity_lambda_;
            local_148.multithreaded =
                 (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            piVar5 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            local_148.threads = uVar1;
            for (piVar12 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start; piVar12 != piVar5;
                piVar12 = piVar12 + 1) {
              AppendHumanReadable(*piVar12,&local_148.name);
            }
            if (2.220446049250313e-16 <= ABS(this_00->min_time_)) {
              StringPrintF_abi_cxx11_(&local_78,"/min_time:%0.3f");
              std::__cxx11::string::append((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_78);
            }
            if (this_00->repetitions_ != 0) {
              StringPrintF_abi_cxx11_(&local_78,"/repeats:%d");
              std::__cxx11::string::append((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_78);
            }
            if ((this_00->use_manual_time_ != false) || (this_00->use_real_time_ == true)) {
              std::__cxx11::string::append((char *)&local_148);
            }
            if ((this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              StringPrintF_abi_cxx11_(&local_78,"/threads:%d",(ulong)(uint)local_148.threads);
              std::__cxx11::string::append((string *)&local_148);
              std::__cxx11::string::~string((string *)&local_78);
            }
            bVar7 = Regex::Match(&local_58,&local_148.name);
            if (bVar7) {
              local_148.last_benchmark_instance =
                   std::operator==(__x,(this_00->args_).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + -1);
              std::
              vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ::push_back(benchmarks,&local_148);
            }
            Benchmark::Instance::~Instance(&local_148);
          }
        }
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_a8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cerr,"Could not compile benchmark re: ");
    poVar10 = std::operator<<(poVar10,(string *)&local_98);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  Regex::~Regex(&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  return bVar6;
}

Assistant:

bool BenchmarkFamilies::FindBenchmarks(
    const std::string& spec,
    std::vector<Benchmark::Instance>* benchmarks) {
  // Make regular expression out of command-line flag
  std::string error_msg;
  Regex re;
  if (!re.Init(spec, &error_msg)) {
    std::cerr << "Could not compile benchmark re: " << error_msg << std::endl;
    return false;
  }

  // Special list of thread counts to use when none are specified
  std::vector<int> one_thread;
  one_thread.push_back(1);

  MutexLock l(mutex_);
  for (std::unique_ptr<Benchmark>& bench_family : families_) {
    // Family was deleted or benchmark doesn't match
    if (!bench_family) continue;
    BenchmarkImp* family = bench_family->imp_;

    if (family->ArgsCnt() == -1) {
      family->Args({});
    }

    for (auto const& args : family->args_) {
      const std::vector<int>* thread_counts =
        (family->thread_counts_.empty()
         ? &one_thread
         : &family->thread_counts_);
      for (int num_threads : *thread_counts) {

        Benchmark::Instance instance;
        instance.name = family->name_;
        instance.benchmark = bench_family.get();
        instance.report_mode = family->report_mode_;
        instance.arg = args;
        instance.time_unit = family->time_unit_;
        instance.range_multiplier = family->range_multiplier_;
        instance.min_time = family->min_time_;
        instance.repetitions = family->repetitions_;
        instance.use_real_time = family->use_real_time_;
        instance.use_manual_time = family->use_manual_time_;
        instance.complexity = family->complexity_;
        instance.complexity_lambda = family->complexity_lambda_;
        instance.threads = num_threads;
        instance.multithreaded = !(family->thread_counts_.empty());

        // Add arguments to instance name
        for (auto const& arg : args) {
          AppendHumanReadable(arg, &instance.name);
        }

        if (!IsZero(family->min_time_)) {
          instance.name +=  StringPrintF("/min_time:%0.3f",  family->min_time_);
        }
        if (family->repetitions_ != 0) {
          instance.name +=  StringPrintF("/repeats:%d",  family->repetitions_);
        }
        if (family->use_manual_time_) {
          instance.name +=  "/manual_time";
        } else if (family->use_real_time_) {
          instance.name +=  "/real_time";
        }

        // Add the number of threads used to the name
        if (!family->thread_counts_.empty()) {
          instance.name += StringPrintF("/threads:%d", instance.threads);
        }

        if (re.Match(instance.name)) {
          instance.last_benchmark_instance = (args == family->args_.back());
          benchmarks->push_back(instance);
        }
      }
    }
  }
  return true;
}